

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::setProperties(FederateState *this,ActionMessage *cmd)

{
  FederateStates FVar1;
  action_t aVar2;
  ulong uVar3;
  ActionMessage *in_RSI;
  FederateState *in_RDI;
  int in_stack_00000008;
  int in_stack_0000000c;
  FederateState *in_stack_00000010;
  int in_stack_000001b4;
  FederateState *in_stack_000001b8;
  Time in_stack_000001c0;
  ActionMessage *in_stack_000002a0;
  FederateState *in_stack_000002a8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int32_t iVar4;
  undefined4 in_stack_ffffffffffffffd4;
  
  FVar1 = std::atomic::operator_cast_to_FederateStates((atomic<helics::FederateStates> *)0x5b25c1);
  if (FVar1 == CREATED) {
    aVar2 = ActionMessage::action(in_RSI);
    uVar3 = (ulong)(uint)(aVar2 + 0xffffff36);
    switch(uVar3) {
    case 0:
      spinlock(in_RDI);
      setProperty(in_stack_000001b8,in_stack_000001b4,in_stack_000001c0);
      unlock((FederateState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      break;
    case 1:
      spinlock(in_RDI);
      iVar4 = in_RSI->messageID;
      ActionMessage::getExtraData((ActionMessage *)0x5b26a0);
      setProperty(in_stack_00000010,in_stack_0000000c,in_stack_00000008);
      unlock((FederateState *)CONCAT44(in_stack_ffffffffffffffd4,iVar4));
      break;
    case 2:
      spinlock(in_RDI);
      iVar4 = in_RSI->messageID;
      checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(in_RSI,indicator_flag);
      setOptionFlag(in_RDI,(int)(uVar3 >> 0x20),SUB81(uVar3 >> 0x18,0));
      unlock((FederateState *)CONCAT44(iVar4,in_stack_ffffffffffffffd0));
      break;
    default:
      break;
    case 7:
      spinlock(in_RDI);
      setInterfaceProperty(in_stack_000002a8,in_stack_000002a0);
      unlock((FederateState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
  }
  else {
    aVar2 = ActionMessage::action(in_RSI);
    if (((uint)(aVar2 + 0xffffff36) < 3) || (aVar2 == cmd_interface_configure)) {
      addAction((FederateState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                (ActionMessage *)CONCAT44(aVar2,in_stack_ffffffffffffffc8));
    }
  }
  return;
}

Assistant:

void FederateState::setProperties(const ActionMessage& cmd)
{
    if (state == FederateStates::CREATED) {
        switch (cmd.action()) {
            case CMD_FED_CONFIGURE_FLAG:
                spinlock();
                setOptionFlag(cmd.messageID, checkActionFlag(cmd, indicator_flag));
                unlock();
                break;
            case CMD_FED_CONFIGURE_TIME:
                spinlock();
                setProperty(cmd.messageID, cmd.actionTime);
                unlock();
                break;
            case CMD_FED_CONFIGURE_INT:
                spinlock();
                setProperty(cmd.messageID, cmd.getExtraData());
                unlock();
                break;
            case CMD_INTERFACE_CONFIGURE:
                spinlock();
                setInterfaceProperty(cmd);
                unlock();
                break;
            default:
                break;
        }
    } else {
        switch (cmd.action()) {
            case CMD_FED_CONFIGURE_FLAG:
            case CMD_FED_CONFIGURE_TIME:
            case CMD_FED_CONFIGURE_INT:
            case CMD_INTERFACE_CONFIGURE:
                addAction(cmd);
                break;
            default:
                break;
        }
    }
}